

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusreply.h
# Opt level: O1

QDBusReply<QDBusObjectPath> * __thiscall
QDBusReply<QDBusObjectPath>::operator=(QDBusReply<QDBusObjectPath> *this,QDBusMessage *reply)

{
  int iVar1;
  QMetaTypeInterface *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  QMetaType QVar6;
  anon_union_24_3_e3d07ef4_for_data *paVar7;
  long in_FS_OFFSET;
  QDBusObjectPath t;
  QMetaType local_68;
  char16_t *pcStack_60;
  qsizetype local_58;
  QMetaType local_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  ulong uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  paVar7 = &local_48;
  local_48._16_8_ = 0xaaaaaaaaaaaaaaaa;
  uStack_30 = 0xaaaaaaaaaaaaaaaa;
  local_48.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
  local_48._8_8_ = 0xaaaaaaaaaaaaaaaa;
  QVariant::QVariant((QVariant *)paVar7,(QMetaType)0x12a468,(void *)0x0);
  qDBusReplyFill(reply,&this->m_error,(QVariant *)paVar7);
  local_50.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QDBusObjectPath>::metaType;
  local_68.d_ptr = (QMetaTypeInterface *)(uStack_30 & 0xfffffffffffffffc);
  bVar5 = comparesEqual(&local_68,&local_50);
  if (bVar5) {
    if ((uStack_30 & 1) == 0) {
      paVar7 = &local_48;
    }
    else {
      paVar7 = (anon_union_24_3_e3d07ef4_for_data *)
               (local_48.shared + *(int *)(local_48.shared + 4));
    }
    local_68.d_ptr = (QMetaTypeInterface *)paVar7->shared;
    pcStack_60 = *(char16_t **)(paVar7->data + 8);
    local_58 = *(qsizetype *)(paVar7->data + 0x10);
    if (local_68.d_ptr != (QMetaTypeInterface *)0x0) {
      LOCK();
      *(int *)local_68.d_ptr = *(int *)local_68.d_ptr + 1;
      UNLOCK();
    }
  }
  else {
    local_68.d_ptr = (QMetaTypeInterface *)0x0;
    pcStack_60 = (char16_t *)0x0;
    local_58 = 0;
    QVar6.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
    if ((uStack_30 & 1) != 0) {
      paVar7 = (anon_union_24_3_e3d07ef4_for_data *)
               (local_48.shared + *(int *)(local_48.shared + 4));
    }
    QMetaType::convert(QVar6,paVar7,local_50,&local_68);
  }
  pQVar2 = (QMetaTypeInterface *)(this->m_data).m_path.d.d;
  pcVar3 = (this->m_data).m_path.d.ptr;
  (this->m_data).m_path.d.d = (Data *)local_68.d_ptr;
  (this->m_data).m_path.d.ptr = pcStack_60;
  qVar4 = (this->m_data).m_path.d.size;
  (this->m_data).m_path.d.size = local_58;
  local_68.d_ptr = pQVar2;
  pcStack_60 = pcVar3;
  local_58 = qVar4;
  if (pQVar2 != (QMetaTypeInterface *)0x0) {
    LOCK();
    *(int *)pQVar2 = *(int *)pQVar2 + -1;
    iVar1._0_2_ = pQVar2->revision;
    iVar1._2_2_ = pQVar2->alignment;
    UNLOCK();
    if (iVar1 == 0) {
      QArrayData::deallocate((QArrayData *)pQVar2,2,0x10);
    }
  }
  QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDBusReply& operator=(const QDBusMessage &reply)
    {
        QVariant data(QMetaType::fromType<Type>());
        qDBusReplyFill(reply, m_error, data);
        m_data = qvariant_cast<Type>(data);
        return *this;
    }